

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O2

void test_pto(void)

{
  int iVar1;
  quicly_sent_packet_t *pqVar2;
  quicly_sent_acked_cb p_Var3;
  quicly_sentmap_iter_t iter;
  quicly_sentmap_t map;
  
  on_acked_callcnt = 0;
  on_acked_ackcnt = 0;
  map.head = (st_quicly_sent_block_t *)0x0;
  map.tail = (st_quicly_sent_block_t *)0x0;
  map.num_packets = 0;
  map.bytes_in_flight = 0;
  map._pending_packet = (quicly_sent_t *)0x0;
  p_Var3 = (quicly_sent_acked_cb)0x1;
  quicly_sentmap_prepare(&map,1,0,'\0');
  quicly_sentmap_allocate(&map,p_Var3);
  quicly_sentmap_commit(&map,10);
  p_Var3 = (quicly_sent_acked_cb)0x2;
  quicly_sentmap_prepare(&map,2,0,'\0');
  quicly_sentmap_allocate(&map,p_Var3);
  quicly_sentmap_commit(&map,0x14);
  _ok((uint)(map.bytes_in_flight == 0x1e),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0xa6);
  quicly_sentmap_init_iter(&map,&iter);
  pqVar2 = quicly_sentmap_get(&iter);
  if (pqVar2->packet_number != 1) {
    __assert_fail("sent->packet_number == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                  ,0xab,"void test_pto(void)");
  }
  iVar1 = quicly_sentmap_update(&map,&iter,QUICLY_SENTMAP_EVENT_PTO);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0xac);
  _ok((uint)(on_acked_callcnt == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0xad);
  _ok((uint)(on_acked_ackcnt == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0xae);
  _ok((uint)(map.bytes_in_flight == 0x1e),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0xaf);
  quicly_sentmap_init_iter(&map,&iter);
  pqVar2 = quicly_sentmap_get(&iter);
  if (pqVar2->packet_number == 1) {
    iVar1 = quicly_sentmap_update(&map,&iter,QUICLY_SENTMAP_EVENT_ACKED);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
        0xb5);
    pqVar2 = quicly_sentmap_get(&iter);
    if (pqVar2->packet_number == 2) {
      iVar1 = quicly_sentmap_update(&map,&iter,QUICLY_SENTMAP_EVENT_ACKED);
      _ok((uint)(iVar1 == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0xb8);
      _ok((uint)(on_acked_callcnt == 3),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0xb9);
      _ok((uint)(on_acked_ackcnt == 2),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0xba);
      _ok((uint)(map.bytes_in_flight == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0xbb);
      quicly_sentmap_dispose(&map);
      return;
    }
    __assert_fail("sent->packet_number == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                  ,0xb7,"void test_pto(void)");
  }
  __assert_fail("sent->packet_number == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                ,0xb4,"void test_pto(void)");
}

Assistant:

static void test_pto(void)
{
    quicly_sentmap_t map;
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;

    on_acked_callcnt = 0;
    on_acked_ackcnt = 0;

    quicly_sentmap_init(&map);

    /* commit pn 1, 2 */
    quicly_sentmap_prepare(&map, 1, 0, QUICLY_EPOCH_INITIAL);
    quicly_sentmap_allocate(&map, on_acked);
    quicly_sentmap_commit(&map, 10);
    quicly_sentmap_prepare(&map, 2, 0, QUICLY_EPOCH_INITIAL);
    quicly_sentmap_allocate(&map, on_acked);
    quicly_sentmap_commit(&map, 20);
    ok(map.bytes_in_flight == 30);

    /* mark pn 1 for PTO */
    quicly_sentmap_init_iter(&map, &iter);
    sent = quicly_sentmap_get(&iter);
    assert(sent->packet_number == 1);
    ok(quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_PTO) == 0);
    ok(on_acked_callcnt == 1);
    ok(on_acked_ackcnt == 0);
    ok(map.bytes_in_flight == 30);

    /* mark pn 1, 2 as acked */
    quicly_sentmap_init_iter(&map, &iter);
    sent = quicly_sentmap_get(&iter);
    assert(sent->packet_number == 1);
    ok(quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_ACKED) == 0);
    sent = quicly_sentmap_get(&iter);
    assert(sent->packet_number == 2);
    ok(quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_ACKED) == 0);
    ok(on_acked_callcnt == 3);
    ok(on_acked_ackcnt == 2);
    ok(map.bytes_in_flight == 0);

    quicly_sentmap_dispose(&map);
}